

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016e220 = 0x2d2d2d2d2d2d2d;
    uRam000000000016e227._0_1_ = '-';
    uRam000000000016e227._1_1_ = '-';
    uRam000000000016e227._2_1_ = '-';
    uRam000000000016e227._3_1_ = '-';
    uRam000000000016e227._4_1_ = '-';
    uRam000000000016e227._5_1_ = '-';
    uRam000000000016e227._6_1_ = '-';
    uRam000000000016e227._7_1_ = '-';
    DAT_0016e210 = '-';
    DAT_0016e210_1._0_1_ = '-';
    DAT_0016e210_1._1_1_ = '-';
    DAT_0016e210_1._2_1_ = '-';
    DAT_0016e210_1._3_1_ = '-';
    DAT_0016e210_1._4_1_ = '-';
    DAT_0016e210_1._5_1_ = '-';
    DAT_0016e210_1._6_1_ = '-';
    uRam000000000016e218 = 0x2d2d2d2d2d2d2d;
    DAT_0016e21f = 0x2d;
    DAT_0016e200 = '-';
    DAT_0016e200_1._0_1_ = '-';
    DAT_0016e200_1._1_1_ = '-';
    DAT_0016e200_1._2_1_ = '-';
    DAT_0016e200_1._3_1_ = '-';
    DAT_0016e200_1._4_1_ = '-';
    DAT_0016e200_1._5_1_ = '-';
    DAT_0016e200_1._6_1_ = '-';
    uRam000000000016e208._0_1_ = '-';
    uRam000000000016e208._1_1_ = '-';
    uRam000000000016e208._2_1_ = '-';
    uRam000000000016e208._3_1_ = '-';
    uRam000000000016e208._4_1_ = '-';
    uRam000000000016e208._5_1_ = '-';
    uRam000000000016e208._6_1_ = '-';
    uRam000000000016e208._7_1_ = '-';
    DAT_0016e1f0 = '-';
    DAT_0016e1f0_1._0_1_ = '-';
    DAT_0016e1f0_1._1_1_ = '-';
    DAT_0016e1f0_1._2_1_ = '-';
    DAT_0016e1f0_1._3_1_ = '-';
    DAT_0016e1f0_1._4_1_ = '-';
    DAT_0016e1f0_1._5_1_ = '-';
    DAT_0016e1f0_1._6_1_ = '-';
    uRam000000000016e1f8._0_1_ = '-';
    uRam000000000016e1f8._1_1_ = '-';
    uRam000000000016e1f8._2_1_ = '-';
    uRam000000000016e1f8._3_1_ = '-';
    uRam000000000016e1f8._4_1_ = '-';
    uRam000000000016e1f8._5_1_ = '-';
    uRam000000000016e1f8._6_1_ = '-';
    uRam000000000016e1f8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000016e1e8._0_1_ = '-';
    uRam000000000016e1e8._1_1_ = '-';
    uRam000000000016e1e8._2_1_ = '-';
    uRam000000000016e1e8._3_1_ = '-';
    uRam000000000016e1e8._4_1_ = '-';
    uRam000000000016e1e8._5_1_ = '-';
    uRam000000000016e1e8._6_1_ = '-';
    uRam000000000016e1e8._7_1_ = '-';
    DAT_0016e22f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << '\n';
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }